

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quad.cpp
# Opt level: O3

string * __thiscall Quad::toString_abi_cxx11_(Quad *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint __val;
  Quad *pQVar4;
  uint uVar5;
  Vec2d **ppVVar6;
  undefined8 *puVar7;
  long *plVar8;
  undefined8 *puVar9;
  string *psVar10;
  uint uVar11;
  ulong *puVar12;
  size_type *psVar13;
  ulong uVar14;
  long lVar15;
  undefined8 uVar16;
  uint __len;
  size_type *local_c8;
  string __str;
  string local_98;
  Quad *local_78;
  string local_70;
  string local_50;
  
  local_78 = this;
  ppVVar6 = getExtremities(this);
  puVar7 = (undefined8 *)operator_new(0x20);
  Vec2d::toString_abi_cxx11_(&local_98,*ppVVar6);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_98);
  paVar1 = &local_50.field_2;
  puVar12 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar12) {
    local_50.field_2._M_allocated_capacity = *puVar12;
    local_50.field_2._8_8_ = plVar8[3];
    local_50._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_50.field_2._M_allocated_capacity = *puVar12;
    local_50._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_50._M_string_length = plVar8[1];
  *plVar8 = (long)puVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  Vec2d::toString_abi_cxx11_(&local_70,ppVVar6[1]);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    uVar16 = local_50.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_70._M_string_length + local_50._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar16 = local_70.field_2._M_allocated_capacity;
    }
    if (local_70._M_string_length + local_50._M_string_length <= (ulong)uVar16) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_70,0,(char *)0x0,(ulong)local_50._M_dataplus._M_p);
      goto LAB_001171d5;
    }
  }
  puVar9 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
LAB_001171d5:
  *puVar7 = puVar7 + 2;
  puVar2 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar2) {
    uVar16 = puVar9[3];
    puVar7[2] = *puVar2;
    puVar7[3] = uVar16;
  }
  else {
    *puVar7 = (undefined8 *)*puVar9;
    puVar7[2] = *puVar2;
  }
  puVar7[1] = puVar9[1];
  *puVar9 = puVar2;
  puVar9[1] = 0;
  *(undefined1 *)puVar2 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  __str.field_2._8_8_ = puVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  psVar10 = (string *)operator_new(0x20);
  uVar3 = local_78->vertexCount;
  __val = -uVar3;
  if (0 < (int)uVar3) {
    __val = uVar3;
  }
  __len = 1;
  if (9 < __val) {
    uVar14 = (ulong)__val;
    uVar5 = 4;
    do {
      __len = uVar5;
      uVar11 = (uint)uVar14;
      if (uVar11 < 100) {
        __len = __len - 2;
        goto LAB_001172ce;
      }
      if (uVar11 < 1000) {
        __len = __len - 1;
        goto LAB_001172ce;
      }
      if (uVar11 < 10000) goto LAB_001172ce;
      uVar14 = uVar14 / 10000;
      uVar5 = __len + 4;
    } while (99999 < uVar11);
    __len = __len + 1;
  }
LAB_001172ce:
  local_c8 = &__str._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_c8,(char)__len - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_c8),__len,__val);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x12529f);
  uVar16 = __str.field_2._8_8_;
  psVar13 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_70.field_2._M_allocated_capacity = *psVar13;
    local_70.field_2._8_8_ = plVar8[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar13;
    local_70._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_70._M_string_length = plVar8[1];
  *plVar8 = (long)psVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
  psVar13 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_98.field_2._M_allocated_capacity = *psVar13;
    local_98.field_2._8_8_ = plVar8[3];
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar13;
    local_98._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_98._M_string_length = plVar8[1];
  *plVar8 = (long)psVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_98,*(ulong *)uVar16);
  psVar13 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_50.field_2._M_allocated_capacity = *psVar13;
    local_50.field_2._8_8_ = plVar8[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar13;
    local_50._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_50._M_string_length = plVar8[1];
  *plVar8 = (long)psVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
  (psVar10->_M_dataplus)._M_p = (pointer)&psVar10->field_2;
  psVar13 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar13) {
    lVar15 = plVar8[3];
    (psVar10->field_2)._M_allocated_capacity = *psVar13;
    *(long *)((long)&psVar10->field_2 + 8) = lVar15;
  }
  else {
    (psVar10->_M_dataplus)._M_p = (pointer)*plVar8;
    (psVar10->field_2)._M_allocated_capacity = *psVar13;
  }
  psVar10->_M_string_length = plVar8[1];
  *plVar8 = (long)psVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_c8 != &__str._M_string_length) {
    operator_delete(local_c8);
  }
  pQVar4 = local_78;
  if (0 < local_78->vertexCount) {
    lVar15 = 0;
    do {
      std::__cxx11::string::append((char *)psVar10);
      Vec2d::toString_abi_cxx11_(&local_50,pQVar4->vertices[lVar15]);
      std::__cxx11::string::_M_append((char *)psVar10,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      std::__cxx11::string::append((char *)psVar10);
      lVar15 = lVar15 + 1;
    } while (lVar15 < pQVar4->vertexCount);
  }
  operator_delete__(ppVVar6);
  return psVar10;
}

Assistant:

string* Quad::toString() {
    Vec2d** extremities = getExtremities();
    string* extremitiesString = new string(extremities[0]->toString() + " -> " + extremities[1]->toString());
    string* quadString = new string(" - QUAD (" + to_string(vertexCount) + " vertices, Extremities: " + *extremitiesString + "):\n");
    for (int i=0; i < vertexCount; i++) {
        *quadString += "   - ";
        *quadString += vertices[i]->toString();
        *quadString += "\n";
    }
    delete[] extremities;
    extremities = nullptr;
    return quadString;
}